

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char[2],int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
          (char (*arg) [2],int *args,char (*args_1) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          char (*args_3) [9])

{
  undefined8 in_RDI;
  int *in_R8;
  char (*in_R9) [4];
  string local_70 [8];
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [16];
  char (*in_stack_ffffffffffffffc0) [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff98);
  StringBuilder<int,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[9]>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}